

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O3

void write_table32hi(z_word_t *table,int k)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    if (lVar5 == 0) {
      uVar3 = (ulong)*(uint *)((long)table + 4);
      pcVar4 = "";
LAB_00101767:
      pcVar2 = ", ";
    }
    else {
      cVar1 = (char)(((uint)lVar5 & 0xff) / 5) * -5;
      pcVar4 = "    ";
      if ((char)(cVar1 + (char)lVar5) != '\0') {
        pcVar4 = "";
      }
      uVar3 = (ulong)*(uint *)((long)table + lVar5 * 8 + 4);
      if (lVar5 == 0xff) {
        printf("%s0x%08x%s",pcVar4,uVar3,"");
        return;
      }
      pcVar2 = ",\n";
      if ((char)(cVar1 + (char)lVar5) != '\x04') goto LAB_00101767;
    }
    printf("%s0x%08x%s",pcVar4,uVar3,pcVar2);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void write_table32hi(const z_word_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n] >> 32),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}